

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O2

string * __thiscall
t_d_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  uint uVar2;
  _func_int *p_Var3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  t_const_value_type tVar7;
  t_type *ptVar8;
  ostream *poVar9;
  _Base_ptr p_Var10;
  int64_t iVar11;
  ostringstream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var13;
  char *pcVar14;
  t_type *ptVar15;
  pointer pptVar16;
  undefined1 auVar17 [12];
  string val;
  string val_1;
  string local_1c8;
  ostringstream out;
  
  ptVar8 = t_type::get_true_type(type);
  this_00 = (ostringstream *)&out;
  std::__cxx11::ostringstream::ostringstream(this_00);
  iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[5])(ptVar8);
  if ((char)iVar6 == '\0') {
    iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[10])(ptVar8);
    if ((char)iVar6 == '\0') {
      poVar9 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"{");
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar9 = t_generator::indent((t_generator *)this,
                                   &out.super_basic_ostream<char,_std::char_traits<char>_>);
      render_type_name_abi_cxx11_(&val,this,ptVar8,false);
      poVar9 = std::operator<<(poVar9,(string *)&val);
      poVar9 = std::operator<<(poVar9," v;");
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&val);
      iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xb])(ptVar8);
      if (((char)iVar6 == '\0') &&
         (iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xc])(ptVar8), (char)iVar6 == '\0')) {
        iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0x10])(ptVar8);
        if ((char)iVar6 == '\0') {
          iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xe])(ptVar8);
          if ((char)iVar6 == '\0') {
            iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xf])(ptVar8);
            if ((char)iVar6 == '\0') {
              pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[3])(ptVar8);
              std::operator+(pbVar12,"Compiler error: Invalid type in render_const_value: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var_00,iVar6));
              __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            ptVar8 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
            for (pptVar16 = (value->listVal_).
                            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                pptVar16 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish; pptVar16 = pptVar16 + 1) {
              render_const_value_abi_cxx11_(&val,this,ptVar8,*pptVar16);
              poVar9 = t_generator::indent((t_generator *)this,
                                           &out.super_basic_ostream<char,_std::char_traits<char>_>);
              poVar9 = std::operator<<(poVar9,"v ~= ");
              poVar9 = std::operator<<(poVar9,(string *)&val);
              poVar9 = std::operator<<(poVar9,";");
              std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)&val);
            }
          }
          else {
            ptVar8 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
            for (pptVar16 = (value->listVal_).
                            super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                pptVar16 !=
                (value->listVal_).
                super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                super__Vector_impl_data._M_finish; pptVar16 = pptVar16 + 1) {
              render_const_value_abi_cxx11_(&val,this,ptVar8,*pptVar16);
              poVar9 = t_generator::indent((t_generator *)this,
                                           &out.super_basic_ostream<char,_std::char_traits<char>_>);
              poVar9 = std::operator<<(poVar9,"v ~= ");
              poVar9 = std::operator<<(poVar9,(string *)&val);
              poVar9 = std::operator<<(poVar9,";");
              std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)&val);
            }
          }
        }
        else {
          ptVar15 = *(t_type **)&ptVar8[1].super_t_doc.has_doc_;
          ptVar8 = *(t_type **)&ptVar8[1].annotations_._M_t._M_impl;
          for (p_Var10 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var10 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
            render_const_value_abi_cxx11_(&val,this,ptVar15,*(t_const_value **)(p_Var10 + 1));
            render_const_value_abi_cxx11_(&val_1,this,ptVar8,(t_const_value *)p_Var10[1]._M_parent);
            poVar9 = t_generator::indent((t_generator *)this,
                                         &out.super_basic_ostream<char,_std::char_traits<char>_>);
            std::operator<<(poVar9,"v[");
            bVar5 = is_immutable_type(this,ptVar15);
            if (!bVar5) {
              poVar9 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                       "cast(immutable(");
              render_type_name_abi_cxx11_(&local_1c8,this,ptVar15,false);
              poVar9 = std::operator<<(poVar9,(string *)&local_1c8);
              std::operator<<(poVar9,"))");
              std::__cxx11::string::~string((string *)&local_1c8);
            }
            poVar9 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                     (string *)&val);
            poVar9 = std::operator<<(poVar9,"] = ");
            poVar9 = std::operator<<(poVar9,(string *)&val_1);
            poVar9 = std::operator<<(poVar9,";");
            std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&val_1);
            std::__cxx11::string::~string((string *)&val);
          }
        }
      }
      else {
        poVar9 = t_generator::indent((t_generator *)this,
                                     &out.super_basic_ostream<char,_std::char_traits<char>_>);
        poVar9 = std::operator<<(poVar9,"v = ");
        iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xc])(ptVar8);
        pcVar14 = "";
        if ((char)iVar6 != '\0') {
          pcVar14 = "new ";
        }
        poVar9 = std::operator<<(poVar9,pcVar14);
        render_type_name_abi_cxx11_(&val,this,ptVar8,false);
        poVar9 = std::operator<<(poVar9,(string *)&val);
        poVar9 = std::operator<<(poVar9,"();");
        std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&val);
        for (p_Var10 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          ptVar15 = (t_type *)0x0;
          for (pp_Var13 = ptVar8[1].super_t_doc._vptr_t_doc;
              pp_Var13 != (_func_int **)ptVar8[1].super_t_doc.doc_._M_dataplus._M_p;
              pp_Var13 = pp_Var13 + 1) {
            p_Var3 = *pp_Var13;
            std::__cxx11::string::string((string *)&val,(string *)(*(long *)(p_Var10 + 1) + 0x48));
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var3 + 0x68),&val);
            std::__cxx11::string::~string((string *)&val);
            if (_Var4) {
              ptVar15 = *(t_type **)(*pp_Var13 + 0x60);
            }
          }
          if (ptVar15 == (t_type *)0x0) {
            pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[3])(ptVar8);
            std::operator+(&val_1,"Type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar6));
            std::operator+(&val,&val_1," has no field ");
            std::__cxx11::string::string
                      ((string *)&local_1c8,(string *)(*(long *)(p_Var10 + 1) + 0x48));
            std::operator+(pbVar12,&val,&local_1c8);
            __cxa_throw(pbVar12,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          render_const_value_abi_cxx11_(&val,this,ptVar15,(t_const_value *)p_Var10[1]._M_parent);
          poVar9 = t_generator::indent((t_generator *)this,
                                       &out.super_basic_ostream<char,_std::char_traits<char>_>);
          poVar9 = std::operator<<(poVar9,"v.set!`");
          std::__cxx11::string::string((string *)&val_1,(string *)(*(long *)(p_Var10 + 1) + 0x48));
          poVar9 = std::operator<<(poVar9,(string *)&val_1);
          poVar9 = std::operator<<(poVar9,"`(");
          poVar9 = std::operator<<(poVar9,(string *)&val);
          poVar9 = std::operator<<(poVar9,");");
          std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&val_1);
          std::__cxx11::string::~string((string *)&val);
        }
      }
      poVar9 = t_generator::indent((t_generator *)this,
                                   &out.super_basic_ostream<char,_std::char_traits<char>_>);
      poVar9 = std::operator<<(poVar9,"return v;");
      std::operator<<(poVar9,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar9 = t_generator::indent((t_generator *)this,
                                   &out.super_basic_ostream<char,_std::char_traits<char>_>);
      std::operator<<(poVar9,"}()");
      goto LAB_0018e031;
    }
    poVar9 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"cast(");
    render_type_name_abi_cxx11_(&val,this,ptVar8,false);
    poVar9 = std::operator<<(poVar9,(string *)&val);
    poVar9 = std::operator<<(poVar9,")");
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)poVar9);
    goto LAB_0018dc82;
  }
  uVar2 = *(uint *)&ptVar8[1].super_t_doc._vptr_t_doc;
  switch(uVar2) {
  case 1:
    poVar9 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,'\"');
    t_generator::get_escaped_string_abi_cxx11_(&val,(t_generator *)this,value);
    poVar9 = std::operator<<(poVar9,(string *)&val);
    std::operator<<(poVar9,'\"');
    break;
  case 2:
    iVar11 = t_const_value::get_integer(value);
    pcVar14 = "false";
    if (0 < iVar11) {
      pcVar14 = "true";
    }
    goto LAB_0018dcd4;
  case 3:
  case 4:
    poVar9 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"cast(");
    render_type_name_abi_cxx11_(&val,this,ptVar8,false);
    poVar9 = std::operator<<(poVar9,(string *)&val);
    poVar9 = std::operator<<(poVar9,")");
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)poVar9);
    break;
  case 5:
    goto switchD_0018d909_caseD_5;
  case 6:
    t_const_value::get_integer(value);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)&out);
    pcVar14 = "L";
LAB_0018dcd4:
    std::operator<<((ostream *)this_00,pcVar14);
    goto LAB_0018e031;
  case 7:
    tVar7 = t_const_value::get_type(value);
    if (tVar7 != CV_INTEGER) {
      std::ostream::_M_insert<double>(value->doubleVal_);
      goto LAB_0018e031;
    }
    goto switchD_0018d909_caseD_5;
  default:
    auVar17 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&val,(t_base_type *)(ulong)uVar2,auVar17._8_4_);
    std::operator+(auVar17._0_8_,"Compiler error: No const of base type ",&val);
    __cxa_throw(auVar17._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
LAB_0018dc82:
  std::__cxx11::string::~string((string *)&val);
LAB_0018e031:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
switchD_0018d909_caseD_5:
  t_const_value::get_integer(value);
  std::ostream::_M_insert<long>((long)&out);
  goto LAB_0018e031;
}

Assistant:

string render_const_value(t_type* type, t_const_value* value) {
    // Resolve any typedefs.
    type = get_true_type(type);

    ostringstream out;
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_STRING:
        out << '"' << get_escaped_string(value) << '"';
        break;
      case t_base_type::TYPE_BOOL:
        out << ((value->get_integer() > 0) ? "true" : "false");
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
        out << "cast(" << render_type_name(type) << ")" << value->get_integer();
        break;
      case t_base_type::TYPE_I32:
        out << value->get_integer();
        break;
      case t_base_type::TYPE_I64:
        out << value->get_integer() << "L";
        break;
      case t_base_type::TYPE_DOUBLE:
        if (value->get_type() == t_const_value::CV_INTEGER) {
          out << value->get_integer();
        } else {
          out << value->get_double();
        }
        break;
      default:
        throw "Compiler error: No const of base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "cast(" << render_type_name(type) << ")" << value->get_integer();
    } else {
      out << "{" << endl;
      indent_up();

      indent(out) << render_type_name(type) << " v;" << endl;
      if (type->is_struct() || type->is_xception()) {
        indent(out) << "v = " << (type->is_xception() ? "new " : "") << render_type_name(type)
                    << "();" << endl;

        const vector<t_field*>& fields = ((t_struct*)type)->get_members();
        vector<t_field*>::const_iterator f_iter;
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          t_type* field_type = nullptr;
          for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
            if ((*f_iter)->get_name() == v_iter->first->get_string()) {
              field_type = (*f_iter)->get_type();
            }
          }
          if (field_type == nullptr) {
            throw "Type error: " + type->get_name() + " has no field "
                + v_iter->first->get_string();
          }
          string val = render_const_value(field_type, v_iter->second);
          indent(out) << "v.set!`" << v_iter->first->get_string() << "`(" << val << ");" << endl;
        }
      } else if (type->is_map()) {
        t_type* ktype = ((t_map*)type)->get_key_type();
        t_type* vtype = ((t_map*)type)->get_val_type();
        const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
        map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string key = render_const_value(ktype, v_iter->first);
          string val = render_const_value(vtype, v_iter->second);
          indent(out) << "v[";
          if (!is_immutable_type(ktype)) {
            out << "cast(immutable(" << render_type_name(ktype) << "))";
          }
          out << key << "] = " << val << ";" << endl;
        }
      } else if (type->is_list()) {
        t_type* etype = ((t_list*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else if (type->is_set()) {
        t_type* etype = ((t_set*)type)->get_elem_type();
        const vector<t_const_value*>& val = value->get_list();
        vector<t_const_value*>::const_iterator v_iter;
        for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
          string val = render_const_value(etype, *v_iter);
          indent(out) << "v ~= " << val << ";" << endl;
        }
      } else {
        throw "Compiler error: Invalid type in render_const_value: " + type->get_name();
      }
      indent(out) << "return v;" << endl;

      indent_down();
      indent(out) << "}()";
    }

    return out.str();
  }